

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::operator[](json *this,char *name)

{
  json *pjVar1;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *name_local;
  json *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,name,&local_39);
  pjVar1 = operator[](this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return pjVar1;
}

Assistant:

json &json::operator[](const char *name)
{
    return (*this)[string(name)];
}